

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void PredictBatch(int mode,int x_start,int y,int num_pixels,uint32_t *current,uint32_t *upper,
                 uint32_t *out)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  uint32_t *in_R8;
  uint32_t *in_R9;
  int local_10;
  int local_8;
  
  local_10 = in_ECX;
  local_8 = in_ESI;
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      (*VP8LPredictorsSub[0])(in_R8,(uint32_t *)0x0,1,upper);
    }
    else {
      (*VP8LPredictorsSub[2])(in_R8,in_R9,1,upper);
    }
    local_8 = 1;
    upper = upper + 1;
    local_10 = in_ECX + -1;
  }
  if (in_EDX == 0) {
    (*VP8LPredictorsSub[1])(in_R8 + local_8,(uint32_t *)0x0,local_10,upper);
  }
  else {
    (*VP8LPredictorsSub[in_EDI])(in_R8 + local_8,in_R9 + local_8,local_10,upper);
  }
  return;
}

Assistant:

static WEBP_INLINE void PredictBatch(int mode, int x_start, int y,
                                     int num_pixels, const uint32_t* current,
                                     const uint32_t* upper, uint32_t* out) {
  if (x_start == 0) {
    if (y == 0) {
      // ARGB_BLACK.
      VP8LPredictorsSub[0](current, NULL, 1, out);
    } else {
      // Top one.
      VP8LPredictorsSub[2](current, upper, 1, out);
    }
    ++x_start;
    ++out;
    --num_pixels;
  }
  if (y == 0) {
    // Left one.
    VP8LPredictorsSub[1](current + x_start, NULL, num_pixels, out);
  } else {
    VP8LPredictorsSub[mode](current + x_start, upper + x_start, num_pixels,
                            out);
  }
}